

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetKotlinFactoryName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor)

{
  bool bVar1;
  AlphaNum *b;
  undefined1 in_R8B;
  string_view input;
  string_view field_name;
  AlphaNum local_d0;
  AlphaNum local_a0;
  undefined1 local_60 [16];
  string_view local_50;
  undefined1 local_40 [8];
  string name;
  Descriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  name.field_2._8_8_ = descriptor;
  local_50 = Descriptor::name(descriptor);
  input._M_str = (char *)0x1;
  input._M_len = (size_t)local_50._M_str;
  b = (AlphaNum *)0x1;
  ToCamelCase_abi_cxx11_((string *)local_40,(java *)local_50._M_len,input,(bool)in_R8B);
  local_60 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  field_name._M_str = local_60._8_8_;
  field_name._M_len = (size_t)field_name._M_str;
  bVar1 = IsForbiddenKotlin(local_60._0_8_,field_name);
  if (bVar1) {
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,"_");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_a0,&local_d0,b);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetKotlinFactoryName(
    const Descriptor* descriptor) {
  std::string name = ToCamelCase(descriptor->name(), /* lower_first = */ true);
  return IsForbiddenKotlin(name) ? absl::StrCat(name, "_") : name;
}